

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateVPTests.cpp
# Opt level: O0

Texture2D * __thiscall
vkt::DynamicState::anon_unknown_4::ViewportParamTestInstane::buildReferenceFrame
          (Texture2D *__return_storage_ptr__,ViewportParamTestInstane *this)

{
  PixelBufferAccess *pPVar1;
  Vector<float,_4> local_6c;
  float local_5c;
  int local_58;
  float xCoord;
  int x;
  float yCoord;
  int y;
  int local_3c;
  int local_38;
  deInt32 frameHeight;
  deInt32 frameWidth;
  TextureFormat local_24;
  undefined1 local_19;
  ViewportParamTestInstane *local_18;
  ViewportParamTestInstane *this_local;
  Texture2D *referenceFrame;
  
  local_19 = 0;
  local_18 = this;
  this_local = (ViewportParamTestInstane *)__return_storage_ptr__;
  local_24 = ::vk::mapVkFormat((this->super_ViewportStateBaseCase).super_DynamicStateBaseClass.
                               m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D(__return_storage_ptr__,&local_24,0x80,0x80);
  tcu::Texture2D::allocLevel(__return_storage_ptr__,0);
  local_38 = tcu::Texture2D::getWidth(__return_storage_ptr__);
  local_3c = tcu::Texture2D::getHeight(__return_storage_ptr__);
  pPVar1 = tcu::TextureLevelPyramid::getLevel(&__return_storage_ptr__->super_TextureLevelPyramid,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&yCoord,0.0,0.0,0.0,1.0);
  tcu::clear(pPVar1,(Vec4 *)&yCoord);
  for (x = 0; x < local_3c; x = x + 1) {
    xCoord = (float)x / ((float)local_3c * 0.5) - 1.0;
    for (local_58 = 0; local_58 < local_38; local_58 = local_58 + 1) {
      local_5c = (float)local_58 / ((float)local_38 * 0.5) - 1.0;
      if ((((0.0 <= local_5c) && (local_5c <= 1.0)) && (0.0 <= xCoord)) && (xCoord <= 1.0)) {
        pPVar1 = tcu::TextureLevelPyramid::getLevel
                           (&__return_storage_ptr__->super_TextureLevelPyramid,0);
        tcu::Vector<float,_4>::Vector(&local_6c,0.0,1.0,0.0,1.0);
        tcu::PixelBufferAccess::setPixel(pPVar1,&local_6c,local_58,x,0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual tcu::Texture2D buildReferenceFrame (void)
	{
		tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
		referenceFrame.allocLevel(0);

		const deInt32 frameWidth	= referenceFrame.getWidth();
		const deInt32 frameHeight	= referenceFrame.getHeight();

		tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

		for (int y = 0; y < frameHeight; y++)
		{
			const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

			for (int x = 0; x < frameWidth; x++)
			{
				const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

				if (xCoord >= 0.0f && xCoord <= 1.0f && yCoord >= 0.0f && yCoord <= 1.0f)
					referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f), x, y);
			}
		}

		return referenceFrame;
	}